

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::populate_grid(Plotter *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer puVar6;
  pointer pPVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  int iVar13;
  uint uVar14;
  pointer puVar15;
  ulong uVar16;
  long lVar17;
  unsigned_long uVar18;
  long lVar19;
  pointer pDVar20;
  size_t id;
  ulong uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  size_t j;
  long *in_FS_OFFSET;
  int iVar25;
  double dVar26;
  int iVar32;
  undefined1 auVar27 [16];
  int iVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  size_t hi;
  ulong local_98;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *local_90;
  anon_class_24_3_02951b27 bfs;
  PointMarker local_70;
  size_t lo;
  
  this_00 = &this->grid;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(long)(this->view).shigh * (long)(this->view).swid);
  puVar6 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar15 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar6; puVar15 = puVar15 + 1)
  {
    *puVar15 = 0xffffffffffffffff;
  }
  if ((char)in_FS_OFFSET[-0x8f] == '\0') {
    in_FS_OFFSET[-0x90] = 0;
    in_FS_OFFSET[-0x92] = 0;
    in_FS_OFFSET[-0x91] = 0;
    __cxa_thread_atexit(std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                        ~vector,*in_FS_OFFSET + -0x490,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x8f) = 1;
  }
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
             (*in_FS_OFFSET + -0x490),(long)(this->view).shigh * (long)(this->view).swid);
  bfs.lo = &lo;
  lo = 0;
  bfs.hi = &hi;
  hi = 0;
  local_90 = &this->pt_markers;
  lVar19 = 0x30;
  uVar21 = 0;
  while( true ) {
    pPVar7 = (this->pt_markers).
             super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar16 = ((long)(this->pt_markers).
                    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) / 0x38;
    if (uVar16 <= uVar21) break;
    if ((*(char *)((long)&pPVar7->x + lVar19) == '\0') &&
       ((*(long *)((long)pPVar7 + lVar19 + -0x10) != -1 ||
        (*(long *)((long)pPVar7 + lVar19 + -8) != -1)))) {
      dVar12 = (this->view).ymax;
      dVar3 = (this->view).xmin;
      uVar1 = (this->view).swid;
      uVar4 = (this->view).shigh;
      auVar33._0_8_ = (double)(int)uVar4 * (dVar12 - *(double *)((long)pPVar7 + lVar19 + -0x28));
      auVar33._8_8_ = (double)(int)uVar1 * (*(double *)((long)pPVar7 + lVar19 + -0x30) - dVar3);
      auVar27._0_8_ = dVar12 - (this->view).ymin;
      auVar27._8_8_ = (this->view).xmax - dVar3;
      auVar34 = divpd(auVar33,auVar27);
      iVar25 = (int)((float)auVar34._0_8_ + 0.5);
      iVar31 = (int)((float)auVar34._8_8_ + 0.5);
      auVar10._4_4_ = -(uint)(-1 < iVar25);
      auVar10._0_4_ = -(uint)(-1 < iVar31);
      auVar10._8_4_ = -(uint)(iVar31 < (int)uVar1);
      auVar10._12_4_ = -(uint)(iVar25 < (int)uVar4);
      iVar13 = movmskps((int)uVar16,auVar10);
      if (iVar13 == 0xf) {
        uVar14 = iVar31 + uVar1 * iVar25;
        puVar15 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (puVar15[uVar14] == 0xffffffffffffffff) {
          puVar15[(int)uVar14] = uVar21;
          lVar24 = in_FS_OFFSET[-0x92];
          lVar17 = hi * 0x10;
          *(ulong *)(lVar24 + lVar17) = CONCAT44(iVar31,iVar25);
          *(int *)(lVar24 + 8 + lVar17) = (int)uVar21;
          *(undefined4 *)(lVar24 + 0xc + lVar17) = 0;
          hi = hi + 1;
        }
      }
    }
    uVar21 = uVar21 + 1;
    lVar19 = lVar19 + 0x38;
  }
  bfs.this = this;
  populate_grid::anon_class_24_3_02951b27::operator()(&bfs);
  lVar19 = 0x30;
  uVar21 = 0;
  while( true ) {
    pPVar7 = (this->pt_markers).
             super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar16 = ((long)(this->pt_markers).
                    super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) / 0x38;
    if (uVar16 <= uVar21) break;
    if (((*(char *)((long)&pPVar7->x + lVar19) == '\0') &&
        (*(long *)((long)pPVar7 + lVar19 + -0x10) == -1)) &&
       (*(long *)((long)pPVar7 + lVar19 + -8) == -1)) {
      dVar12 = (this->view).ymax;
      dVar3 = (this->view).xmin;
      uVar2 = (this->view).swid;
      uVar5 = (this->view).shigh;
      auVar35._0_8_ = (double)(int)uVar5 * (dVar12 - *(double *)((long)pPVar7 + lVar19 + -0x28));
      auVar35._8_8_ = (double)(int)uVar2 * (*(double *)((long)pPVar7 + lVar19 + -0x30) - dVar3);
      auVar28._0_8_ = dVar12 - (this->view).ymin;
      auVar28._8_8_ = (this->view).xmax - dVar3;
      auVar34 = divpd(auVar35,auVar28);
      iVar25 = (int)((float)auVar34._0_8_ + 0.5);
      iVar31 = (int)((float)auVar34._8_8_ + 0.5);
      auVar11._4_4_ = -(uint)(-1 < iVar25);
      auVar11._0_4_ = -(uint)(-1 < iVar31);
      auVar11._8_4_ = -(uint)(iVar31 < (int)uVar2);
      auVar11._12_4_ = -(uint)(iVar25 < (int)uVar5);
      iVar13 = movmskps((int)uVar16,auVar11);
      if (iVar13 == 0xf) {
        uVar14 = iVar31 + uVar2 * iVar25;
        puVar15 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (puVar15[uVar14] == 0xffffffffffffffff) {
          puVar15[(int)uVar14] = uVar21;
          lVar24 = in_FS_OFFSET[-0x92];
          lVar17 = hi * 0x10;
          *(ulong *)(lVar24 + lVar17) = CONCAT44(iVar31,iVar25);
          *(int *)(lVar24 + 8 + lVar17) = (int)uVar21;
          *(undefined4 *)(lVar24 + 0xc + lVar17) = 0;
          hi = hi + 1;
        }
      }
    }
    uVar21 = uVar21 + 1;
    lVar19 = lVar19 + 0x38;
  }
  populate_grid::anon_class_24_3_02951b27::operator()(&bfs);
  uVar21 = 0;
  while (pDVar20 = (this->draw_buf).
                   super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        uVar21 < (ulong)((long)(this->draw_buf).
                               super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar20 >> 7)) {
    local_98 = uVar21;
    if (pDVar20[uVar21].type == POLYLINE) {
      pDVar20 = pDVar20 + uVar21;
      for (uVar21 = 1;
          lVar19 = *(long *)&(pDVar20->points).
                             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                             ._M_impl,
          uVar21 < (ulong)((long)*(pointer *)
                                  ((long)&(pDVar20->points).
                                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                          ._M_impl + 8) - lVar19 >> 4); uVar21 = uVar21 + 1) {
        lVar24 = uVar21 * 0x10;
        uVar18 = ((long)(this->pt_markers).
                        super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->pt_markers).
                       super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x38;
        local_70.x = *(double *)(lVar19 + -0x10 + lVar24);
        local_70.y = *(double *)(lVar19 + -8 + lVar24);
        local_70.label = LABEL_NONE;
        local_70.rel_func = pDVar20->rel_func;
        local_70.passive = true;
        local_70.drag_var_x._0_4_ = 0xffffffff;
        local_70.drag_var_x._4_4_ = 0xffffffff;
        local_70.drag_var_y._0_4_ = 0xffffffff;
        local_70.drag_var_y._4_4_ = 0xffffffff;
        std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
        emplace_back<nivalis::PointMarker>(local_90,&local_70);
        iVar13 = (this->view).swid;
        dVar26 = (double)iVar13;
        dVar3 = (this->view).xmin;
        dVar12 = (this->view).xmax - dVar3;
        auVar29._0_8_ = dVar26 * (*(double *)(lVar19 + lVar24) - dVar3);
        auVar29._8_8_ = dVar26 * (*(double *)(lVar19 + -0x10 + lVar24) - dVar3);
        auVar34._8_4_ = SUB84(dVar12,0);
        auVar34._0_8_ = dVar12;
        auVar34._12_4_ = (int)((ulong)dVar12 >> 0x20);
        auVar34 = divpd(auVar29,auVar34);
        iVar25 = (int)((float)auVar34._8_8_ + 0.5);
        if (((-1 < iVar25) && (iVar25 < iVar13)) && ((int)((float)auVar34._0_8_ + 0.5) - iVar25 < 2)
           ) {
          iVar13 = (this->view).shigh;
          dVar3 = (this->view).ymax;
          auVar30._0_8_ = (double)iVar13 * (dVar3 - *(double *)(lVar19 + lVar24 + -8));
          auVar30._8_8_ = (double)iVar13 * (dVar3 - *(double *)(lVar19 + lVar24 + 8));
          dVar3 = dVar3 - (this->view).ymin;
          auVar9._8_4_ = SUB84(dVar3,0);
          auVar9._0_8_ = dVar3;
          auVar9._12_4_ = (int)((ulong)dVar3 >> 0x20);
          auVar34 = divpd(auVar30,auVar9);
          iVar31 = (int)((float)auVar34._0_8_ + 0.5);
          iVar32 = (int)((float)auVar34._8_8_ + 0.5);
          bVar8 = iVar31 <= iVar32;
          if (iVar31 < 1) {
            iVar31 = 0;
          }
          if (iVar13 + -1 < iVar31) {
            iVar31 = iVar13 + -1;
          }
          iVar22 = (uint)bVar8 * 2 + -1;
          if (iVar32 < 1) {
            iVar32 = 0;
          }
          while( true ) {
            iVar23 = iVar13 + -1;
            if (iVar32 <= iVar13 + -1) {
              iVar23 = iVar32;
            }
            if (iVar31 == iVar23 + iVar22) break;
            iVar23 = (this->view).swid * iVar31 + iVar25;
            puVar15 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (puVar15[iVar23] == 0xffffffffffffffff) {
              puVar15[iVar23] = uVar18;
              lVar19 = in_FS_OFFSET[-0x92];
              lVar24 = hi * 0x10;
              *(int *)(lVar19 + lVar24) = iVar31;
              *(int *)(lVar19 + 4 + lVar24) = iVar25;
              *(int *)(lVar19 + 8 + lVar24) = (int)uVar18;
              *(undefined4 *)(lVar19 + 0xc + lVar24) = 0;
              iVar13 = (this->view).shigh;
              hi = hi + 1;
            }
            iVar31 = iVar31 + iVar22;
          }
        }
      }
    }
    uVar21 = local_98 + 1;
  }
  populate_grid::anon_class_24_3_02951b27::operator()(&bfs);
  return;
}

Assistant:

void Plotter::populate_grid() {
    const int r = marker_clickable_radius;
    grid.resize(view.swid * view.shigh);
    std::fill(grid.begin(), grid.end(), -1);

    thread_local std::vector<
            std::array<int, 4> // y x id dist
            > que;
    que.resize(view.swid * view.shigh);

    size_t lo = 0, hi = 0;
    auto bfs = [&]{
        // BFS to fill grid
        while(lo < hi) {
            const auto& v = que[lo++];
            int sy = v[0], sx = v[1], id = v[2], d = v[3];
            if (d >= marker_clickable_radius) continue;
            if (sy > 0 && grid[(sy - 1) * view.swid + sx] == -1) {
                que[hi++] = { sy - 1, sx, id, d + 1};
                grid[(sy - 1) * view.swid + sx] = id;
            }
            if (sx > 0 && grid[sy * view.swid + sx - 1] == -1) {
                que[hi++] = { sy, sx - 1, id, d + 1};
                grid[sy * view.swid + sx - 1] = id;
            }
            if (sx < view.swid - 1 && grid[sy * view.swid + sx + 1] == -1) {
                que[hi++] = { sy, sx + 1, id, d + 1};
                grid[sy * view.swid + sx + 1] = id;
            }
            if (sy < view.shigh - 1 && grid[(sy + 1) * view.swid + sx] == -1) {
                que[hi++] = { sy + 1, sx, id, d + 1};
                grid[(sy + 1) * view.swid + sx] = id;
            }
        }
    };

    // Pass 1: BFS from draggable markers
    for (size_t id = 0; id < pt_markers.size(); ++id) {
        auto& ptm = pt_markers[id];
        if (ptm.passive || (ptm.drag_var_x == -1 && ptm.drag_var_y == -1)) continue;
        int sx = (int)(0.5 + _X_TO_SX(ptm.x));
        int sy = (int)(0.5 + _Y_TO_SY(ptm.y));
        if (sx < 0 || sy < 0 || sx >= view.swid || sy >= view.shigh)
            continue;
        if (~grid[sy * view.swid + sx]) continue;
        grid[sy * view.swid + sx] = id;
        que[hi++] = { sy, sx, (int)id, 0 };
    }
    bfs();
    // Note: hi will be 0 here;

    // Pass 2: BFS from non-draggable, active (i.e. text-on-hover) markers
    // only goes through grid cells not already visited
    for (size_t id = 0; id < pt_markers.size(); ++id) {
        auto& ptm = pt_markers[id];
        if (ptm.passive || !(ptm.drag_var_x == -1 && ptm.drag_var_y == -1)) continue;
        int sx = (int)(0.5 + _X_TO_SX(ptm.x));
        int sy = (int)(0.5 + _Y_TO_SY(ptm.y));
        if (sx < 0 || sy < 0 || sx >= view.swid || sy >= view.shigh)
            continue;
        if (~grid[sy * view.swid + sx]) continue;
        grid[sy * view.swid + sx] = id;
        que[hi++] = { sy, sx, (int)id, 0 };
    }
    bfs();
    // Note: hi will be 0 here;

    // Pass 3: Construct and push passive markers (for clicking on functions)
    for (size_t i = 0; i < draw_buf.size(); ++i) {
        const auto & obj = draw_buf[i];
        if (obj.type == DrawBufferObject::POLYLINE) {
            const auto& points = obj.points;
            for (size_t j = 1; j < points.size(); ++j) {
                const std::array<double, 2>& p = points[j - 1];
                const std::array<double, 2>& q = points[j];
                size_t id = pt_markers.size();
                {
                    PointMarker ptm;
                    ptm.x = p[0]; ptm.y = p[1];
                    ptm.label = PointMarker::LABEL_NONE;
                    ptm.rel_func = obj.rel_func;
                    ptm.passive = true;
                    ptm.drag_var_x = ptm.drag_var_y = -1;
                    pt_markers.push_back(std::move(ptm));
                }
                int psx = (int)(0.5 + _X_TO_SX(p[0]));
                int qsx = (int)(0.5 + _X_TO_SX(q[0]));
                if (psx < 0 || psx >= view.swid || qsx - psx > 1) continue;

                int psy = (int)(0.5 + _Y_TO_SY(p[1]));
                int qsy = (int)(0.5 + _Y_TO_SY(q[1]));
                int dir = qsy >= psy ? 1 : -1;
                for (int r = std::min(std::max(psy, 0), view.shigh - 1);
                        r != std::min(std::max(qsy, 0), view.shigh - 1) + dir; r += dir) {
                    if (~grid[r * view.swid + psx]) continue;
                    grid[r * view.swid + psx] = id;
                    que[hi++] = { r, psx, (int)id, 0 };
                }
            }
        }
    }
    bfs();
}